

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::SerializeWithCachedSizes
          (TreeEnsembleParameters_TreeNode *this,CodedOutputStream *output)

{
  double dVar1;
  int iVar2;
  Type *value;
  int index;
  
  if (this->treeid_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,this->treeid_,output);
  }
  if (this->nodeid_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,this->nodeid_,output);
  }
  if (this->nodebehavior_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(3,this->nodebehavior_,output);
  }
  if (this->branchfeatureindex_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(10,this->branchfeatureindex_,output);
  }
  dVar1 = this->branchfeaturevalue_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    google::protobuf::internal::WireFormatLite::WriteDouble(0xb,dVar1,output);
  }
  if (this->truechildnodeid_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(0xc,this->truechildnodeid_,output);
  }
  if (this->falsechildnodeid_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(0xd,this->falsechildnodeid_,output);
  }
  if (this->missingvaluetrackstruechild_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(0xe,true,output);
  }
  iVar2 = (this->evaluationinfo_).super_RepeatedPtrFieldBase.current_size_;
  for (index = 0; iVar2 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>::TypeHandler>
                      (&(this->evaluationinfo_).super_RepeatedPtrFieldBase,index);
    google::protobuf::internal::WireFormatLite::WriteMessage(0x14,&value->super_MessageLite,output);
  }
  dVar1 = this->relativehitrate_;
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteDouble(0x1e,dVar1,output);
  return;
}

Assistant:

void TreeEnsembleParameters_TreeNode::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 treeId = 1;
  if (this->treeid() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->treeid(), output);
  }

  // uint64 nodeId = 2;
  if (this->nodeid() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->nodeid(), output);
  }

  // .CoreML.Specification.TreeEnsembleParameters.TreeNode.TreeNodeBehavior nodeBehavior = 3;
  if (this->nodebehavior() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      3, this->nodebehavior(), output);
  }

  // uint64 branchFeatureIndex = 10;
  if (this->branchfeatureindex() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(10, this->branchfeatureindex(), output);
  }

  // double branchFeatureValue = 11;
  if (this->branchfeaturevalue() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(11, this->branchfeaturevalue(), output);
  }

  // uint64 trueChildNodeId = 12;
  if (this->truechildnodeid() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(12, this->truechildnodeid(), output);
  }

  // uint64 falseChildNodeId = 13;
  if (this->falsechildnodeid() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(13, this->falsechildnodeid(), output);
  }

  // bool missingValueTracksTrueChild = 14;
  if (this->missingvaluetrackstruechild() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(14, this->missingvaluetrackstruechild(), output);
  }

  // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo evaluationInfo = 20;
  for (unsigned int i = 0, n = this->evaluationinfo_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      20, this->evaluationinfo(i), output);
  }

  // double relativeHitRate = 30;
  if (this->relativehitrate() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(30, this->relativehitrate(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.TreeEnsembleParameters.TreeNode)
}